

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImGuiTabItem *pIVar1;
  ImGuiID *pIVar2;
  int *piVar3;
  uint uVar4;
  ImGuiTabBarSortItem *pIVar5;
  ImGuiWindow *pIVar6;
  ImVec2 IVar7;
  bool bVar8;
  bool bVar9;
  ImVec2 size;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  ImGuiID IVar16;
  ImGuiID IVar17;
  ImGuiTabItemFlags IVar18;
  ImGuiContext *pIVar19;
  float fVar20;
  float fVar21;
  ImGuiContext *pIVar22;
  bool bVar23;
  float fVar24;
  float fVar25;
  int iVar26;
  int iVar27;
  ImGuiID IVar28;
  long lVar29;
  ImGuiTabItem *pIVar30;
  int tab_src_n;
  ulong uVar31;
  ImGuiTabItem *pIVar32;
  ImGuiID IVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  ImGuiID *pIVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  ImGuiTabItem item_tmp;
  ImVec4 local_48;
  
  pIVar22 = GImGui;
  tab_bar->WantLayout = false;
  lVar29 = 0;
  uVar34 = 0;
  for (uVar31 = 0; uVar4 = (tab_bar->Tabs).Size, (long)uVar31 < (long)(int)uVar4;
      uVar31 = uVar31 + 1) {
    pIVar30 = (tab_bar->Tabs).Data;
    pIVar38 = (ImGuiID *)((long)&pIVar30->ID + lVar29);
    if (*(int *)((long)&pIVar30->LastFrameVisible + lVar29) < tab_bar->PrevFrameVisible) {
      if (*pIVar38 == tab_bar->SelectedTabId) {
        tab_bar->SelectedTabId = 0;
      }
    }
    else {
      if (uVar31 != uVar34) {
        IVar33 = pIVar38[0];
        IVar28 = pIVar38[1];
        IVar16 = pIVar38[2];
        IVar17 = pIVar38[3];
        fVar39 = (float)pIVar38[4];
        fVar40 = (float)pIVar38[5];
        fVar41 = (float)pIVar38[6];
        piVar3 = &pIVar30[(int)uVar34].LastFrameSelected;
        *piVar3 = pIVar38[3];
        piVar3[1] = (int)fVar39;
        piVar3[2] = (int)fVar40;
        piVar3[3] = (int)fVar41;
        pIVar30 = pIVar30 + (int)uVar34;
        pIVar30->ID = IVar33;
        pIVar30->Flags = IVar28;
        pIVar30->LastFrameVisible = IVar16;
        pIVar30->LastFrameSelected = IVar17;
      }
      uVar34 = uVar34 + 1;
    }
    lVar29 = lVar29 + 0x1c;
  }
  if (uVar4 != uVar34) {
    ImVector<ImGuiTabItem>::resize(&tab_bar->Tabs,uVar34);
  }
  IVar33 = tab_bar->NextSelectedTabId;
  if (IVar33 != 0) {
    tab_bar->SelectedTabId = IVar33;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    pIVar30 = TabBarFindTabByID(tab_bar,tab_bar->ReorderRequestTabId);
    if (pIVar30 != (ImGuiTabItem *)0x0) {
      pIVar32 = (tab_bar->Tabs).Data;
      uVar34 = (int)(((long)pIVar30 - (long)pIVar32) / 0x1c) + tab_bar->ReorderRequestDir;
      if ((-1 < (int)uVar34) && ((int)uVar34 < (tab_bar->Tabs).Size)) {
        item_tmp.ID = pIVar30->ID;
        item_tmp.Flags = pIVar30->Flags;
        uVar10 = pIVar30->LastFrameVisible;
        uVar11 = pIVar30->LastFrameSelected;
        uVar12 = pIVar30->Offset;
        item_tmp.Width = pIVar30->Width;
        item_tmp.WidthContents = pIVar30->WidthContents;
        pIVar1 = pIVar32 + uVar34;
        IVar28 = pIVar1->ID;
        IVar18 = pIVar1->Flags;
        iVar26 = pIVar1->LastFrameVisible;
        iVar27 = pIVar1->LastFrameSelected;
        pIVar1 = pIVar32 + uVar34;
        fVar39 = pIVar1->Offset;
        uVar13 = *(undefined8 *)(&pIVar1->LastFrameSelected + 2);
        pIVar30->LastFrameSelected = pIVar1->LastFrameSelected;
        pIVar30->Offset = fVar39;
        *(undefined8 *)&pIVar30->Width = uVar13;
        pIVar30->ID = IVar28;
        pIVar30->Flags = IVar18;
        pIVar30->LastFrameVisible = iVar26;
        pIVar30->LastFrameSelected = iVar27;
        pIVar30 = pIVar32 + uVar34;
        pIVar30->ID = item_tmp.ID;
        pIVar30->Flags = item_tmp.Flags;
        pIVar30->LastFrameVisible = uVar10;
        pIVar30->LastFrameSelected = uVar11;
        pIVar30 = pIVar32 + uVar34;
        pIVar30->LastFrameSelected = uVar11;
        pIVar30->Offset = (float)uVar12;
        *(undefined8 *)(&pIVar30->LastFrameSelected + 2) = item_tmp._20_8_;
        item_tmp.LastFrameVisible = uVar10;
        item_tmp.LastFrameSelected = uVar11;
        item_tmp.Offset = (float)uVar12;
        if (pIVar32[uVar34].ID == tab_bar->SelectedTabId) {
          IVar33 = pIVar32[uVar34].ID;
        }
      }
      if ((tab_bar->Flags & 0x800000) != 0) {
        MarkIniSettingsDirty();
      }
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  ImVector<ImGuiTabBarSortItem>::resize(&pIVar22->TabSortByWidthBuffer,(tab_bar->Tabs).Size);
  uVar34 = (tab_bar->Tabs).Size;
  lVar29 = 0;
  uVar31 = 0;
  if (0 < (int)uVar34) {
    uVar31 = (ulong)uVar34;
  }
  fVar39 = 0.0;
  uVar36 = 1;
  bVar37 = false;
  pIVar38 = (ImGuiID *)0x0;
  for (uVar35 = 0; uVar31 != uVar35; uVar35 = uVar35 + 1) {
    pIVar30 = (tab_bar->Tabs).Data;
    pIVar2 = (ImGuiID *)((long)&pIVar30->ID + lVar29);
    if ((pIVar38 == (ImGuiID *)0x0) ||
       ((int)pIVar38[3] < *(int *)((long)&pIVar30->LastFrameSelected + lVar29))) {
      pIVar38 = pIVar2;
    }
    if (*pIVar2 == tab_bar->SelectedTabId) {
      bVar37 = true;
    }
    if (lVar29 == 0) {
      fVar40 = 0.0;
    }
    else {
      fVar40 = (pIVar22->Style).ItemInnerSpacing.x;
    }
    fVar41 = *(float *)((long)&pIVar30->WidthContents + lVar29);
    fVar39 = fVar39 + fVar40 + fVar41;
    pIVar5 = (pIVar22->TabSortByWidthBuffer).Data;
    pIVar5[uVar35].Index = (int)uVar35;
    pIVar5[uVar35].Width = fVar41;
    lVar29 = lVar29 + 0x1c;
  }
  fVar40 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  fVar39 = (float)(-(uint)(fVar40 < fVar39) & (uint)(fVar39 - fVar40));
  if ((fVar39 <= 0.0) || ((tab_bar->Flags & 0x40) == 0)) {
    fVar39 = GImGui->FontSize * 20.0;
    for (lVar29 = 0; uVar31 * 0x1c - lVar29 != 0; lVar29 = lVar29 + 0x1c) {
      pIVar30 = (tab_bar->Tabs).Data;
      fVar40 = *(float *)((long)&pIVar30->WidthContents + lVar29);
      if (fVar39 <= fVar40) {
        fVar40 = fVar39;
      }
      *(float *)((long)&pIVar30->Width + lVar29) = fVar40;
    }
  }
  else {
    if (1 < (int)uVar34) {
      qsort((pIVar22->TabSortByWidthBuffer).Data,(long)(pIVar22->TabSortByWidthBuffer).Size,8,
            TabBarSortItemComparer);
      uVar34 = (tab_bar->Tabs).Size;
    }
    while ((uVar31 = uVar36 & 0xffffffff, 0.0 < fVar39 && ((int)uVar36 < (int)uVar34))) {
      uVar36 = (ulong)(int)uVar36;
      pIVar5 = (pIVar22->TabSortByWidthBuffer).Data;
      fVar40 = pIVar5->Width;
      lVar29 = uVar36 << 0x20;
      for (; (long)uVar36 < (long)(int)uVar34; uVar36 = uVar36 + 1) {
        if ((fVar40 != pIVar5[uVar36].Width) || (NAN(fVar40) || NAN(pIVar5[uVar36].Width))) {
          fVar40 = fVar40 - *(float *)((long)&pIVar5->Width + (lVar29 >> 0x1d));
          goto LAB_00148e56;
        }
        lVar29 = lVar29 + 0x100000000;
        uVar31 = (ulong)((int)uVar31 + 1);
      }
      fVar40 = fVar40 + -1.0;
LAB_00148e56:
      fVar41 = fVar39 / (float)(int)uVar36;
      if (fVar40 <= fVar41) {
        fVar41 = fVar40;
      }
      if ((int)uVar31 < 1) {
        uVar31 = 0;
      }
      for (uVar35 = 0; uVar31 != uVar35; uVar35 = uVar35 + 1) {
        pIVar5[uVar35].Width = pIVar5[uVar35].Width - fVar41;
      }
      fVar39 = fVar39 - fVar41 * (float)(int)uVar36;
    }
    uVar36 = 0;
    uVar31 = 0;
    if (0 < (int)uVar34) {
      uVar31 = (ulong)uVar34;
    }
    for (; uVar31 != uVar36; uVar36 = uVar36 + 1) {
      pIVar5 = (pIVar22->TabSortByWidthBuffer).Data;
      (tab_bar->Tabs).Data[pIVar5[uVar36].Index].Width = (float)(int)pIVar5[uVar36].Width;
    }
  }
  fVar39 = 0.0;
  for (lVar29 = 0; uVar31 * 0x1c - lVar29 != 0; lVar29 = lVar29 + 0x1c) {
    pIVar30 = (tab_bar->Tabs).Data;
    *(float *)((long)&pIVar30->Offset + lVar29) = fVar39;
    if ((IVar33 == 0) &&
       (IVar33 = *(ImGuiID *)((long)&pIVar30->ID + lVar29), pIVar22->NavJustMovedToId != IVar33)) {
      IVar33 = 0;
    }
    fVar39 = fVar39 + *(float *)((long)&pIVar30->Width + lVar29) +
                      (pIVar22->Style).ItemInnerSpacing.x;
  }
  fVar39 = fVar39 - (pIVar22->Style).ItemInnerSpacing.x;
  fVar39 = (float)(-(uint)(0.0 <= fVar39) & (uint)fVar39);
  tab_bar->OffsetMax = fVar39;
  tab_bar->OffsetNextTab = 0.0;
  pIVar19 = GImGui;
  fVar40 = (tab_bar->BarRect).Max.x;
  if (((1 < (int)uVar34) && (fVar41 = (tab_bar->BarRect).Min.x, fVar40 - fVar41 < fVar39)) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar6 = GImGui->CurrentWindow;
    fVar42 = GImGui->FontSize + -2.0;
    fVar39 = (GImGui->Style).FramePadding.y;
    size.y = fVar39 + fVar39 + GImGui->FontSize;
    size.x = fVar42;
    fVar43 = fVar42 + fVar42;
    IVar7 = (pIVar6->DC).CursorPos;
    fVar39 = (tab_bar->BarRect).Max.y;
    fVar24 = IVar7.x;
    fVar25 = IVar7.y;
    bVar9 = fVar25 < (tab_bar->BarRect).Min.y;
    bVar8 = fVar40 < fVar43 + fVar24;
    if ((fVar39 < fVar25 || (fVar24 < fVar41 || bVar9)) || bVar8) {
      item_tmp.Flags = (ImGuiTabItemFlags)(fVar39 + 0.0);
      item_tmp.ID = (ImGuiID)((GImGui->Style).ItemInnerSpacing.x + fVar40);
      PushClipRect(&(tab_bar->BarRect).Min,(ImVec2 *)&item_tmp,true);
    }
    item_tmp.ID = (ImGuiID)(pIVar19->Style).Colors[0].x;
    item_tmp.Flags = (ImGuiTabItemFlags)(pIVar19->Style).Colors[0].y;
    uVar14 = (pIVar19->Style).Colors[0].z;
    uVar15 = (pIVar19->Style).Colors[0].w;
    item_tmp.LastFrameSelected = (int)((float)uVar15 * 0.5);
    item_tmp.LastFrameVisible = uVar14;
    PushStyleColor(0,(ImVec4 *)&item_tmp);
    local_48.x = 0.0;
    local_48.y = 0.0;
    local_48.z = 0.0;
    local_48.w = 0.0;
    PushStyleColor(0x15,&local_48);
    fVar20 = (pIVar19->IO).KeyRepeatDelay;
    fVar21 = (pIVar19->IO).KeyRepeatRate;
    (pIVar19->IO).KeyRepeatDelay = 0.25;
    (pIVar19->IO).KeyRepeatRate = 0.2;
    fVar40 = (tab_bar->BarRect).Min.y;
    (pIVar6->DC).CursorPos.x = (tab_bar->BarRect).Max.x - fVar43;
    (pIVar6->DC).CursorPos.y = fVar40;
    bVar23 = ArrowButtonEx("##<",0,size,5);
    iVar26 = -(uint)bVar23;
    fVar40 = (tab_bar->BarRect).Min.y;
    (pIVar6->DC).CursorPos.x = fVar42 + ((tab_bar->BarRect).Max.x - fVar43);
    (pIVar6->DC).CursorPos.y = fVar40;
    bVar23 = ArrowButtonEx("##>",1,size,5);
    if (bVar23) {
      iVar26 = 1;
    }
    PopStyleColor(2);
    (pIVar19->IO).KeyRepeatDelay = fVar20;
    (pIVar19->IO).KeyRepeatRate = fVar21;
    if ((fVar39 < fVar25 || (fVar24 < fVar41 || bVar9)) || bVar8) {
      PopClipRect();
    }
    if ((iVar26 == 0) ||
       (pIVar30 = TabBarFindTabByID(tab_bar,tab_bar->SelectedTabId), pIVar30 == (ImGuiTabItem *)0x0)
       ) {
      pIVar32 = (ImGuiTabItem *)0x0;
    }
    else {
      pIVar32 = (tab_bar->Tabs).Data;
      iVar27 = (int)(((long)pIVar30 - (long)pIVar32) / 0x1c);
      iVar26 = iVar26 + iVar27;
      if ((iVar26 < 0) || ((tab_bar->Tabs).Size <= iVar26)) {
        iVar26 = iVar27;
      }
      pIVar32 = pIVar32 + iVar26;
    }
    (pIVar6->DC).CursorPos = IVar7;
    fVar40 = (tab_bar->BarRect).Max.x - (fVar43 + 1.0);
    (tab_bar->BarRect).Max.x = fVar40;
    if (pIVar32 != (ImGuiTabItem *)0x0) {
      IVar33 = pIVar32->ID;
      tab_bar->SelectedTabId = IVar33;
    }
  }
  if (bVar37) {
    IVar28 = tab_bar->SelectedTabId;
    if (IVar28 != 0) goto LAB_00149207;
  }
  else {
    tab_bar->SelectedTabId = 0;
  }
  IVar28 = 0;
  if ((tab_bar->NextSelectedTabId == 0) && (IVar28 = 0, pIVar38 != (ImGuiID *)0x0)) {
    IVar33 = *pIVar38;
    tab_bar->SelectedTabId = IVar33;
    IVar28 = IVar33;
  }
LAB_00149207:
  tab_bar->VisibleTabId = IVar28;
  tab_bar->VisibleTabWasSubmitted = false;
  if ((IVar33 != 0) && (pIVar30 = TabBarFindTabByID(tab_bar,IVar33), pIVar30 != (ImGuiTabItem *)0x0)
     ) {
    fVar39 = GImGui->FontSize;
    iVar26 = (int)(((long)pIVar30 - (long)(tab_bar->Tabs).Data) / 0x1c);
    fVar41 = fVar39;
    if (iVar26 < 1) {
      fVar41 = -0.0;
    }
    fVar41 = pIVar30->Offset - fVar41;
    if ((tab_bar->Tabs).Size <= iVar26 + 1) {
      fVar39 = 1.0;
    }
    fVar39 = pIVar30->Offset + pIVar30->Width + fVar39;
    fVar24 = tab_bar->ScrollingTarget;
    if (fVar41 < tab_bar->ScrollingTarget) {
      tab_bar->ScrollingTarget = fVar41;
      fVar24 = fVar41;
    }
    fVar40 = fVar40 - (tab_bar->BarRect).Min.x;
    if (fVar24 + fVar40 < fVar39) {
      tab_bar->ScrollingTarget = fVar39 - fVar40;
    }
  }
  fVar39 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingAnim);
  tab_bar->ScrollingAnim = fVar39;
  fVar40 = TabBarScrollClamp(tab_bar,tab_bar->ScrollingTarget);
  tab_bar->ScrollingTarget = fVar40;
  if (tab_bar->PrevFrameVisible + 1 < pIVar22->FrameCount) {
    fVar41 = 3.4028235e+38;
  }
  else {
    fVar41 = (pIVar22->IO).DeltaTime * pIVar22->FontSize * 70.0;
  }
  if ((fVar39 != fVar40) || (NAN(fVar39) || NAN(fVar40))) {
    if (fVar40 <= fVar39) {
      fVar24 = fVar39;
      if (fVar40 < fVar39) {
        uVar34 = -(uint)(fVar40 <= fVar39 - fVar41);
        fVar24 = (float)((uint)(fVar39 - fVar41) & uVar34 | ~uVar34 & (uint)fVar40);
      }
    }
    else {
      fVar24 = fVar39 + fVar41;
      if (fVar40 <= fVar39 + fVar41) {
        fVar24 = fVar40;
      }
    }
    tab_bar->ScrollingAnim = fVar24;
  }
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect
    int tab_dst_n = 0;
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible)
        {
            if (tab->ID == tab_bar->SelectedTabId)
                tab_bar->SelectedTabId = 0;
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId))
        {
            //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
            int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
            if (tab2_order >= 0 && tab2_order < tab_bar->Tabs.Size)
            {
                ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
                ImGuiTabItem item_tmp = *tab1;
                *tab1 = *tab2;
                *tab2 = item_tmp;
                if (tab2->ID == tab_bar->SelectedTabId)
                    scroll_track_selected_tab_id = tab2->ID;
                tab1 = tab2 = NULL;
            }
            if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
                MarkIniSettingsDirty();
        }
        tab_bar->ReorderRequestTabId = 0;
    }

    ImVector<ImGuiTabBarSortItem>& width_sort_buffer = g.TabSortByWidthBuffer;
    width_sort_buffer.resize(tab_bar->Tabs.Size);

    // Compute ideal widths
    float width_total_contents = 0.0f;
    ImGuiTabItem* most_recently_selected_tab = NULL;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;

        // Refresh tab width immediately if we can (for manual tab bar, WidthContent will lag by one frame which is mostly noticeable when changing style.FramePadding.x)
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet, 
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        width_total_contents += (tab_n > 0 ? g.Style.ItemInnerSpacing.x : 0.0f) + tab->WidthContents;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        width_sort_buffer[tab_n].Index = tab_n;
        width_sort_buffer[tab_n].Width = tab->WidthContents;
    }

    // Compute width
    const float width_avail = tab_bar->BarRect.GetWidth();
    float width_excess = (width_avail < width_total_contents) ? (width_total_contents - width_avail) : 0.0f;
    if (width_excess > 0.0f && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown))
    {
        // If we don't have enough room, resize down the largest tabs first
        if (tab_bar->Tabs.Size > 1)
            ImQsort(width_sort_buffer.Data, (size_t)width_sort_buffer.Size, sizeof(ImGuiTabBarSortItem), TabBarSortItemComparer);
        int tab_count_same_width = 1;
        while (width_excess > 0.0f && tab_count_same_width < tab_bar->Tabs.Size)
        {
            while (tab_count_same_width < tab_bar->Tabs.Size && width_sort_buffer[0].Width == width_sort_buffer[tab_count_same_width].Width)
                tab_count_same_width++;
            float width_to_remove_per_tab_max = (tab_count_same_width < tab_bar->Tabs.Size) ? (width_sort_buffer[0].Width - width_sort_buffer[tab_count_same_width].Width) : (width_sort_buffer[0].Width - 1.0f);
            float width_to_remove_per_tab = ImMin(width_excess / tab_count_same_width, width_to_remove_per_tab_max);
            for (int tab_n = 0; tab_n < tab_count_same_width; tab_n++)
                width_sort_buffer[tab_n].Width -= width_to_remove_per_tab;
            width_excess -= width_to_remove_per_tab * tab_count_same_width;
        }
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
            tab_bar->Tabs[width_sort_buffer[tab_n].Index].Width = (float)(int)width_sort_buffer[tab_n].Width;
    }
    else
    {
        const float tab_max_width = TabBarCalcMaxTabWidth();
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            tab->Width = ImMin(tab->WidthContents, tab_max_width);
        }
    }

    // Layout all active tabs
    float offset_x = 0.0f;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        tab->Offset = offset_x;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;
        offset_x += tab->Width + g.Style.ItemInnerSpacing.x;
    }
    tab_bar->OffsetMax = ImMax(offset_x - g.Style.ItemInnerSpacing.x, 0.0f);
    tab_bar->OffsetNextTab = 0.0f;

    // Horizontal scrolling buttons
    const bool scrolling_buttons = (tab_bar->OffsetMax > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll);
    if (scrolling_buttons)
        if (ImGuiTabItem* tab_to_select = TabBarScrollingButtons(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    const float scrolling_speed = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) ? FLT_MAX : (g.IO.DeltaTime * g.FontSize * 70.0f);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
        tab_bar->ScrollingAnim = ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, scrolling_speed);
}